

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O2

void __thiscall MidiOutAlsa::openPort(MidiOutAlsa *this,uint portNumber,string *portName)

{
  undefined8 *puVar1;
  snd_seq_t *seq;
  pointer pcVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  size_t __n;
  ostream *poVar9;
  ostringstream *pinfo;
  string *psVar10;
  undefined8 uStack_290;
  ostringstream local_288 [8];
  snd_seq_addr_t sender;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  undefined1 local_4f;
  snd_seq_addr_t receiver;
  
  pinfo = local_288;
  if ((this->super_MidiOutApi).super_MidiApi.connected_ == true) {
    psVar10 = &(this->super_MidiOutApi).super_MidiApi.errorString_;
    uStack_290 = 0x10d66a;
    std::__cxx11::string::assign((char *)psVar10);
    uStack_290 = 0x10d67c;
    std::__cxx11::string::string((string *)&local_b0,(string *)psVar10);
    uStack_290 = 0x10d689;
    MidiApi::error((MidiApi *)this,WARNING,&local_b0);
    psVar10 = &local_b0;
    pinfo = local_288;
  }
  else {
    uStack_290 = 0x10d6a4;
    iVar6 = (*(this->super_MidiOutApi).super_MidiApi._vptr_MidiApi[8])(this);
    if (iVar6 == 0) {
      psVar10 = &(this->super_MidiOutApi).super_MidiApi.errorString_;
      uStack_290 = 0x10d801;
      std::__cxx11::string::assign((char *)psVar10);
      uStack_290 = 0x10d813;
      std::__cxx11::string::string((string *)&local_90,(string *)psVar10);
      uStack_290 = 0x10d821;
      MidiApi::error((MidiApi *)this,NO_DEVICES_FOUND,&local_90);
      psVar10 = &local_90;
    }
    else {
      uStack_290 = 0x10d6b1;
      lVar8 = snd_seq_port_info_sizeof();
      lVar8 = -(lVar8 + 0xfU & 0xfffffffffffffff0);
      pinfo = local_288 + lVar8;
      *(undefined8 *)(local_288 + lVar8 + -8) = 0x10d6c7;
      __n = snd_seq_port_info_sizeof();
      *(undefined8 *)(local_288 + lVar8 + -8) = 0x10d6d4;
      memset(pinfo,0,__n);
      puVar1 = (undefined8 *)(this->super_MidiOutApi).super_MidiApi.apiData_;
      seq = (snd_seq_t *)*puVar1;
      *(undefined8 *)(local_288 + lVar8 + -8) = 0x42;
      uVar3 = *(undefined8 *)(local_288 + lVar8 + -8);
      *(undefined8 *)(local_288 + lVar8 + -8) = 0x10d6ea;
      uVar7 = portInfo(seq,(snd_seq_port_info_t *)pinfo,(uint)uVar3,portNumber);
      if (uVar7 == 0) {
        *(undefined8 *)(local_288 + lVar8 + -8) = 0x10d83c;
        std::__cxx11::ostringstream::ostringstream(local_288);
        *(undefined8 *)(local_288 + lVar8 + -8) = 0x10d84b;
        poVar9 = std::operator<<((ostream *)local_288,
                                 "MidiOutAlsa::openPort: the \'portNumber\' argument (");
        *(undefined8 *)(local_288 + lVar8 + -8) = 0x10d856;
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        *(undefined8 *)(local_288 + lVar8 + -8) = 0x10d865;
        std::operator<<(poVar9,") is invalid.");
        *(undefined8 *)(local_288 + lVar8 + -8) = 0x10d875;
        std::__cxx11::stringbuf::str();
        psVar10 = &(this->super_MidiOutApi).super_MidiApi.errorString_;
        *(undefined8 *)(local_288 + lVar8 + -8) = 0x10d888;
        std::__cxx11::string::operator=((string *)psVar10,&local_50);
        *(undefined8 *)(local_288 + lVar8 + -8) = 0x10d890;
        std::__cxx11::string::~string(&local_50);
        *(undefined8 *)(local_288 + lVar8 + -8) = 0x10d89c;
        std::__cxx11::string::string((string *)&local_70,(string *)psVar10);
        *(undefined8 *)(local_288 + lVar8 + -8) = 6;
        uVar3 = *(undefined8 *)(local_288 + lVar8 + -8);
        *(undefined8 *)(local_288 + lVar8 + -8) = 0x10d8ab;
        MidiApi::error((MidiApi *)this,(Type)uVar3,&local_70);
        *(undefined8 *)(local_288 + lVar8 + -8) = 0x10d8b4;
        std::__cxx11::string::~string((string *)&local_70);
        *(undefined8 *)(local_288 + lVar8 + -8) = 0x10d8c0;
        std::__cxx11::ostringstream::~ostringstream(local_288);
        return;
      }
      *(undefined8 *)(local_288 + lVar8 + -8) = 0x10d6fa;
      local_50 = (string)snd_seq_port_info_get_client(pinfo);
      *(undefined8 *)(local_288 + lVar8 + -8) = 0x10d705;
      local_4f = snd_seq_port_info_get_port(pinfo);
      uVar3 = *puVar1;
      *(undefined8 *)(local_288 + lVar8 + -8) = 0x10d711;
      local_288[0] = (ostringstream)snd_seq_client_id(uVar3);
      iVar6 = *(int *)((long)puVar1 + 0xc);
      if (iVar6 < 0) {
        uVar3 = *puVar1;
        pcVar2 = (portName->_M_dataplus)._M_p;
        *(undefined8 *)(local_288 + lVar8 + -8) = 0x21;
        uVar4 = *(undefined8 *)(local_288 + lVar8 + -8);
        *(undefined8 *)(local_288 + lVar8 + -8) = 0x10d733;
        iVar6 = snd_seq_create_simple_port(uVar3,pcVar2,uVar4,0x100002);
        *(int *)((long)puVar1 + 0xc) = iVar6;
        if (iVar6 < 0) {
          psVar10 = &(this->super_MidiOutApi).super_MidiApi.errorString_;
          *(undefined8 *)(local_288 + lVar8 + -8) = 0x10d91f;
          std::__cxx11::string::assign((char *)psVar10);
          *(undefined8 *)(local_288 + lVar8 + -8) = 0x10d931;
          std::__cxx11::string::string((string *)&local_110,(string *)psVar10);
          *(undefined8 *)(local_288 + lVar8 + -8) = 8;
          uVar3 = *(undefined8 *)(local_288 + lVar8 + -8);
          *(undefined8 *)(local_288 + lVar8 + -8) = 0x10d93f;
          MidiApi::error((MidiApi *)this,(Type)uVar3,&local_110);
          psVar10 = &local_110;
          goto LAB_0010d946;
        }
      }
      local_288[1] = SUB41(iVar6,0);
      *(undefined8 *)(local_288 + lVar8 + -8) = 0x10d751;
      iVar6 = snd_seq_port_subscribe_malloc(puVar1 + 2);
      uVar3 = puVar1[2];
      if (iVar6 < 0) {
        *(undefined8 *)(local_288 + lVar8 + -8) = 0x10d8ca;
        snd_seq_port_subscribe_free(uVar3);
        psVar10 = &(this->super_MidiOutApi).super_MidiApi.errorString_;
        *(undefined8 *)(local_288 + lVar8 + -8) = 0x10d8dd;
        std::__cxx11::string::assign((char *)psVar10);
        *(undefined8 *)(local_288 + lVar8 + -8) = 0x10d8ef;
        std::__cxx11::string::string((string *)&local_f0,(string *)psVar10);
        *(undefined8 *)(local_288 + lVar8 + -8) = 8;
        uVar3 = *(undefined8 *)(local_288 + lVar8 + -8);
        *(undefined8 *)(local_288 + lVar8 + -8) = 0x10d8fd;
        MidiApi::error((MidiApi *)this,(Type)uVar3,&local_f0);
        psVar10 = &local_f0;
      }
      else {
        *(undefined8 *)(local_288 + lVar8 + -8) = 0x10d769;
        snd_seq_port_subscribe_set_sender(uVar3,local_288);
        uVar3 = puVar1[2];
        *(undefined8 *)(local_288 + lVar8 + -8) = 0x10d776;
        snd_seq_port_subscribe_set_dest(uVar3,&local_50);
        uVar3 = puVar1[2];
        *(undefined8 *)(local_288 + lVar8 + -8) = 1;
        uVar5 = *(ulong *)(local_288 + lVar8 + -8);
        *(undefined8 *)(local_288 + lVar8 + -8) = 0x10d786;
        snd_seq_port_subscribe_set_time_update(uVar3,uVar5 & 0xffffffff);
        uVar3 = puVar1[2];
        *(undefined8 *)(local_288 + lVar8 + -8) = 0x10d792;
        snd_seq_port_subscribe_set_time_real(uVar3,uVar5 & 0xffffffff);
        uVar3 = *puVar1;
        uVar4 = puVar1[2];
        *(undefined8 *)(local_288 + lVar8 + -8) = 0x10d79f;
        iVar6 = snd_seq_subscribe_port(uVar3,uVar4);
        if (iVar6 == 0) {
          (this->super_MidiOutApi).super_MidiApi.connected_ = true;
          return;
        }
        uVar3 = puVar1[2];
        *(undefined8 *)(local_288 + lVar8 + -8) = 0x10d7af;
        snd_seq_port_subscribe_free(uVar3);
        psVar10 = &(this->super_MidiOutApi).super_MidiApi.errorString_;
        *(undefined8 *)(local_288 + lVar8 + -8) = 0x10d7c2;
        std::__cxx11::string::assign((char *)psVar10);
        *(undefined8 *)(local_288 + lVar8 + -8) = 0x10d7d4;
        std::__cxx11::string::string((string *)&local_d0,(string *)psVar10);
        *(undefined8 *)(local_288 + lVar8 + -8) = 8;
        uVar3 = *(undefined8 *)(local_288 + lVar8 + -8);
        *(undefined8 *)(local_288 + lVar8 + -8) = 0x10d7e2;
        MidiApi::error((MidiApi *)this,(Type)uVar3,&local_d0);
        psVar10 = &local_d0;
      }
    }
  }
LAB_0010d946:
  *(undefined8 *)((snd_seq_port_info_t *)pinfo + -8) = 0x10d94b;
  std::__cxx11::string::~string((string *)psVar10);
  return;
}

Assistant:

void MidiOutAlsa :: openPort( unsigned int portNumber, const std::string &portName )
{
  if ( connected_ ) {
    errorString_ = "MidiOutAlsa::openPort: a valid connection already exists!";
    error( RtMidiError::WARNING, errorString_ );
    return;
  }

  unsigned int nSrc = this->getPortCount();
  if ( nSrc < 1 ) {
    errorString_ = "MidiOutAlsa::openPort: no MIDI output sources found!";
    error( RtMidiError::NO_DEVICES_FOUND, errorString_ );
    return;
  }

  snd_seq_port_info_t *pinfo;
  snd_seq_port_info_alloca( &pinfo );
  AlsaMidiData *data = static_cast<AlsaMidiData *> (apiData_);
  if ( portInfo( data->seq, pinfo, SND_SEQ_PORT_CAP_WRITE|SND_SEQ_PORT_CAP_SUBS_WRITE, (int) portNumber ) == 0 ) {
    std::ostringstream ost;
    ost << "MidiOutAlsa::openPort: the 'portNumber' argument (" << portNumber << ") is invalid.";
    errorString_ = ost.str();
    error( RtMidiError::INVALID_PARAMETER, errorString_ );
    return;
  }

  snd_seq_addr_t sender, receiver;
  receiver.client = snd_seq_port_info_get_client( pinfo );
  receiver.port = snd_seq_port_info_get_port( pinfo );
  sender.client = snd_seq_client_id( data->seq );

  if ( data->vport < 0 ) {
    data->vport = snd_seq_create_simple_port( data->seq, portName.c_str(),
                                              SND_SEQ_PORT_CAP_READ|SND_SEQ_PORT_CAP_SUBS_READ,
                                              SND_SEQ_PORT_TYPE_MIDI_GENERIC|SND_SEQ_PORT_TYPE_APPLICATION );
    if ( data->vport < 0 ) {
      errorString_ = "MidiOutAlsa::openPort: ALSA error creating output port.";
      error( RtMidiError::DRIVER_ERROR, errorString_ );
      return;
    }
  }

  sender.port = data->vport;

  // Make subscription
  if ( snd_seq_port_subscribe_malloc( &data->subscription ) < 0 ) {
    snd_seq_port_subscribe_free( data->subscription );
    errorString_ = "MidiOutAlsa::openPort: error allocating port subscription.";
    error( RtMidiError::DRIVER_ERROR, errorString_ );
    return;
  }
  snd_seq_port_subscribe_set_sender( data->subscription, &sender );
  snd_seq_port_subscribe_set_dest( data->subscription, &receiver );
  snd_seq_port_subscribe_set_time_update( data->subscription, 1 );
  snd_seq_port_subscribe_set_time_real( data->subscription, 1 );
  if ( snd_seq_subscribe_port( data->seq, data->subscription ) ) {
    snd_seq_port_subscribe_free( data->subscription );
    errorString_ = "MidiOutAlsa::openPort: ALSA error making port connection.";
    error( RtMidiError::DRIVER_ERROR, errorString_ );
    return;
  }

  connected_ = true;
}